

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O2

acmod_t * acmod_init(ps_config_t *config,logmath_t *lmath,fe_t *fe,feat_t *fcb)

{
  int iVar1;
  acmod_t *acmod;
  ps_config_t *ppVar2;
  logmath_t *plVar3;
  char *pcVar4;
  bin_mdef_t *pbVar5;
  tmat_t *ptVar6;
  ps_mgau_t *ppVar7;
  ps_mllr_t *mllr;
  int16 *piVar8;
  bitvec_t *pbVar9;
  uint8 *puVar10;
  char *fmt;
  long ln;
  double tpfloor;
  long lStack_30;
  
  acmod = (acmod_t *)
          __ckd_calloc__(1,200,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                         ,0xff);
  ppVar2 = ps_config_retain(config);
  acmod->config = ppVar2;
  plVar3 = logmath_retain(lmath);
  acmod->lmath = plVar3;
  acmod->state = '\0';
  iVar1 = acmod_reinit_feat(acmod,fe,fcb);
  if (iVar1 < 0) goto LAB_001196d0;
  pcVar4 = ps_config_str(acmod->config,"mdef");
  if (pcVar4 == (char *)0x0) {
    pcVar4 = ps_config_str(acmod->config,"hmm");
    if (pcVar4 != (char *)0x0) {
      fmt = "Folder \'%s\' does not contain acoustic model definition \'mdef\'\n";
      ln = 0x49;
      goto LAB_00119689;
    }
    pcVar4 = "Acoustic model definition is not specified either with -mdef option or with -hmm\n";
    lStack_30 = 0x46;
  }
  else {
    pbVar5 = bin_mdef_read(acmod->config,pcVar4);
    acmod->mdef = pbVar5;
    if (pbVar5 == (bin_mdef_t *)0x0) {
      fmt = "Failed to read acoustic model definition from %s\n";
      ln = 0x4f;
LAB_00119689:
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
              ,ln,fmt,pcVar4);
      goto LAB_001196d0;
    }
    pcVar4 = ps_config_str(acmod->config,"tmat");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "No tmat file specified\n";
      lStack_30 = 0x55;
    }
    else {
      plVar3 = acmod->lmath;
      tpfloor = ps_config_float(acmod->config,"tmatfloor");
      ptVar6 = tmat_init(pcVar4,plVar3,(float64)tpfloor,1);
      acmod->tmat = ptVar6;
      pcVar4 = ps_config_str(acmod->config,"mean");
      if (((pcVar4 != (char *)0x0) &&
          (pcVar4 = ps_config_str(acmod->config,"var"), pcVar4 != (char *)0x0)) &&
         (pcVar4 = ps_config_str(acmod->config,"tmat"), pcVar4 != (char *)0x0)) {
        pcVar4 = ps_config_str(acmod->config,"senmgau");
        if (pcVar4 == (char *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x6b,"Attempting to use PTM computation module\n");
          ppVar7 = ptm_mgau_init(acmod,acmod->mdef);
          acmod->mgau = ppVar7;
          if (ppVar7 == (ps_mgau_t *)0x0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                    ,0x6d,"Attempting to use semi-continuous computation module\n");
            ppVar7 = s2_semi_mgau_init(acmod);
            acmod->mgau = ppVar7;
            if (ppVar7 == (ps_mgau_t *)0x0) {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                      ,0x6f,"Falling back to general multi-stream GMM computation\n");
              ppVar7 = ms_mgau_init(acmod,acmod->lmath,acmod->mdef);
              acmod->mgau = ppVar7;
              if (ppVar7 == (ps_mgau_t *)0x0) {
                pcVar4 = "Failed to read acoustic model\n";
                lStack_30 = 0x72;
                goto LAB_001196c8;
              }
            }
          }
        }
        else {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x65,"Using general multi-stream GMM computation\n");
          ppVar7 = ms_mgau_init(acmod,acmod->lmath,acmod->mdef);
          acmod->mgau = ppVar7;
          if (ppVar7 == (ps_mgau_t *)0x0) goto LAB_001196d0;
        }
        pcVar4 = ps_config_str(acmod->config,"mllr");
        if (pcVar4 == (char *)0x0) {
LAB_001197a4:
          piVar8 = (int16 *)__ckd_calloc__((long)acmod->mdef->n_sen,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                           ,0x10e);
          acmod->senone_scores = piVar8;
          pbVar9 = (bitvec_t *)
                   __ckd_calloc__((long)((acmod->mdef->n_sen + 0x1f) / 0x20),4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                  ,0x10f);
          acmod->senone_active_vec = pbVar9;
          puVar10 = (uint8 *)__ckd_calloc__((long)acmod->mdef->n_sen,1,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                                            ,0x111);
          acmod->senone_active = puVar10;
          iVar1 = logmath_get_zero(acmod->lmath);
          acmod->log_zero = iVar1;
          iVar1 = ps_config_bool(config,"compallsen");
          acmod->compallsen = (uint8)iVar1;
          return acmod;
        }
        mllr = ps_mllr_read(pcVar4);
        if (mllr != (ps_mllr_t *)0x0) {
          acmod_update_mllr(acmod,mllr);
          goto LAB_001197a4;
        }
        goto LAB_001196d0;
      }
      pcVar4 = "No mean/var/tmat files specified\n";
      lStack_30 = 0x60;
    }
  }
LAB_001196c8:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c",
          lStack_30,pcVar4);
LAB_001196d0:
  acmod_free(acmod);
  return (acmod_t *)0x0;
}

Assistant:

acmod_t *
acmod_init(ps_config_t *config, logmath_t *lmath, fe_t *fe, feat_t *fcb)
{
    acmod_t *acmod;

    acmod = ckd_calloc(1, sizeof(*acmod));
    acmod->config = ps_config_retain(config);
    acmod->lmath = logmath_retain(lmath);
    acmod->state = ACMOD_IDLE;

    /* Initialize or retain fe and fcb. */
    if (acmod_reinit_feat(acmod, fe, fcb) < 0)
        goto error_out;

    /* Load acoustic model parameters. */
    if (acmod_init_am(acmod) < 0)
        goto error_out;

    /* Senone computation stuff. */
    acmod->senone_scores = ckd_calloc(bin_mdef_n_sen(acmod->mdef),
                                                     sizeof(*acmod->senone_scores));
    acmod->senone_active_vec = bitvec_alloc(bin_mdef_n_sen(acmod->mdef));
    acmod->senone_active = ckd_calloc(bin_mdef_n_sen(acmod->mdef),
                                                     sizeof(*acmod->senone_active));
    acmod->log_zero = logmath_get_zero(acmod->lmath);
    acmod->compallsen = ps_config_bool(config, "compallsen");
    return acmod;

error_out:
    acmod_free(acmod);
    return NULL;
}